

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

type * append_type(type *head,type *el)

{
  type *ptVar1;
  anon_union_8_5_3fbb1736_for_u *local_28;
  type **holder;
  type *el_local;
  type *head_local;
  
  head_local = el;
  if (head != (type *)0x0) {
    if (head->mode == TM_PTR) {
      local_28 = &head->u;
    }
    else {
      if (head->mode == TM_ARR) {
        ptVar1 = (head->u).ptr_type;
      }
      else {
        if (head->mode != TM_FUNC) {
          __assert_fail("head->mode == TM_FUNC",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1b18,"struct type *append_type(struct type *, struct type *)");
        }
        ptVar1 = (head->u).ptr_type;
      }
      local_28 = (anon_union_8_5_3fbb1736_for_u *)&ptVar1->arr_type;
    }
    ptVar1 = append_type(local_28->ptr_type,el);
    local_28->ptr_type = ptVar1;
    head_local = head;
  }
  return head_local;
}

Assistant:

static struct type *append_type (struct type *head, struct type *el) {
  struct type **holder;

  if (head == NULL) return el;
  if (head->mode == TM_PTR) {
    holder = &head->u.ptr_type;
  } else if (head->mode == TM_ARR) {
    holder = &head->u.arr_type->el_type;
  } else {
    assert (head->mode == TM_FUNC);
    holder = &head->u.func_type->ret_type;
  }
  *holder = append_type (*holder, el);
  return head;
}